

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O3

int gost_imit_init_cpa(EVP_MD_CTX *ctx)

{
  gost_ctx *c;
  
  c = (gost_ctx *)EVP_MD_CTX_get0_md_data();
  c[1].master_key[6] = 0;
  c[1].master_key[0] = 0;
  c[1].master_key[1] = 0;
  c[1].master_key[2] = 0;
  c[1].master_key[3] = 0;
  c[1].master_key[4] = 0;
  c[1].master_key[5] = 1;
  c[1].key[0] = 4;
  gost_init(c,&Gost28147_CryptoProParamSetA);
  return 1;
}

Assistant:

static int gost_imit_init_cpa(EVP_MD_CTX *ctx)
{
    return gost_imit_init(ctx, &Gost28147_CryptoProParamSetA);
}